

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O2

void __thiscall
f8n::runtime::MessageQueue::UnregisterForBroadcasts(MessageQueue *this,IMessageTarget *target)

{
  _Rb_tree_node_base *p_Var1;
  weak_ptr<f8n::runtime::IMessageTarget> it;
  shared_ptr<f8n::runtime::IMessageTarget> shared;
  LockT lock;
  __weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2> _Stack_68;
  set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  *local_58;
  __shared_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2> local_50;
  unique_lock<std::mutex> local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->queueMutex);
  local_58 = &this->receivers;
  p_Var1 = (this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var1 == &(this->receivers)._M_t._M_impl.super__Rb_tree_header) {
LAB_001cfdcf:
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return;
    }
    std::__weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&_Stack_68,
               (__weak_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 1))
    ;
    std::__shared_ptr<f8n::runtime::IMessageTarget,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&_Stack_68);
    if (local_50._M_ptr == target && local_50._M_ptr != (IMessageTarget *)0x0) {
      std::
      _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
      ::erase(&local_58->_M_t,(key_type *)&_Stack_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_68._M_refcount);
      goto LAB_001cfdcf;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_68._M_refcount);
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  } while( true );
}

Assistant:

void MessageQueue::UnregisterForBroadcasts(IMessageTarget *target) {
    LockT lock(this->queueMutex);
    for (auto it : this->receivers) {
        auto shared = it.lock();
        if (shared && shared.get() == target) {
            this->receivers.erase(it);
            return;
        }
    }
}